

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Creature.cpp
# Opt level: O3

void __thiscall Creature::Creature(Creature *this,Population *pop,size_t chromnom)

{
  double dVar1;
  Creature *pCVar2;
  Chromosome *this_00;
  shared_ptr<Chromosome> local_48;
  Creature *local_38;
  
  this->_vptr_Creature = (_func_int **)&PTR__Creature_0011d700;
  (this->chroms).
  super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->chroms).
  super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chroms).
  super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->domain).first = 0.0;
  (this->domain).second = 0.0;
  this->pntpop = pop;
  this->dead = false;
  SERIALCTR = SERIALCTR + 1;
  this->SERIALNO = SERIALCTR;
  local_38 = this;
  if (chromnom != 0) {
    do {
      this_00 = (Chromosome *)operator_new(0x30);
      Chromosome::Chromosome(this_00,1,0x19);
      boost::shared_ptr<Chromosome>::shared_ptr<Chromosome>(&local_48,this_00);
      std::vector<boost::shared_ptr<Chromosome>,std::allocator<boost::shared_ptr<Chromosome>>>::
      emplace_back<boost::shared_ptr<Chromosome>>
                ((vector<boost::shared_ptr<Chromosome>,std::allocator<boost::shared_ptr<Chromosome>>>
                  *)&this->chroms,&local_48);
      boost::detail::shared_count::~shared_count(&local_48.pn);
      chromnom = chromnom - 1;
    } while (chromnom != 0);
  }
  pCVar2 = local_38;
  (local_38->domain).first = -10.0;
  (local_38->domain).second = 10.0;
  dVar1 = make_fitness(local_38);
  pCVar2->fitness = dVar1;
  return;
}

Assistant:

Creature::Creature( Population * pop, size_t chromnom ) :
	pntpop(pop), dead(false), SERIALNO(++Creature::SERIALCTR)
{
	for(size_t i = 0; i < chromnom; ++i)
	{
		chroms.push_back(shared_ptr<Chromosome> (new Chromosome()));
	}

	set_bounds(-10, 10);
	fitness = make_fitness();
}